

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper.cpp
# Opt level: O1

void destStore64Gray16(QRasterBuffer *rasterBuffer,int x,int y,QRgba64 *buffer,int length)

{
  long lVar1;
  uchar *puVar2;
  quint64 qVar3;
  bool bVar4;
  ulong uVar5;
  unsigned_short uVar6;
  long in_FS_OFFSET;
  QColorTransform tf;
  QColorSpace fromCS;
  QColorTransformPrivate *local_40;
  QColorSpace local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (0 < length) {
    lVar1 = rasterBuffer->bytes_per_line;
    puVar2 = rasterBuffer->m_buffer;
    uVar5 = 0;
    do {
      qVar3 = buffer[uVar5].rgba;
      uVar6 = (unsigned_short)qVar3;
      if ((uVar6 != (unsigned_short)(qVar3 >> 0x10)) || (uVar6 != (unsigned_short)(qVar3 >> 0x20)))
      {
        local_38.d_ptr.d.ptr =
             (QExplicitlySharedDataPointer<QColorSpacePrivate>)&DAT_aaaaaaaaaaaaaaaa;
        bVar4 = QColorSpace::isValid(&rasterBuffer->colorSpace);
        if (bVar4) {
          QColorSpace::QColorSpace(&local_38,&rasterBuffer->colorSpace);
        }
        else {
          QColorSpace::QColorSpace(&local_38,SRgb);
        }
        local_40 = (QColorTransformPrivate *)&DAT_aaaaaaaaaaaaaaaa;
        QColorSpacePrivate::transformationToXYZ((QColorSpacePrivate *)&local_40);
        QColorTransformPrivate::apply<unsigned_short,QRgba64>
                  (local_40,(unsigned_short *)(puVar2 + (long)x * 2 + y * lVar1),buffer,
                   (ulong)(uint)length,(TransformFlags)0x2);
        QColorTransform::~QColorTransform((QColorTransform *)&local_40);
        QColorSpace::~QColorSpace(&local_38);
        break;
      }
      *(unsigned_short *)((long)(puVar2 + (long)x * 2 + y * lVar1) + uVar5 * 2) = uVar6;
      uVar5 = uVar5 + 1;
    } while ((uint)length != uVar5);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void QT_FASTCALL destStore64Gray16(QRasterBuffer *rasterBuffer, int x, int y, const QRgba64 *buffer, int length)
{
    quint16 *data = reinterpret_cast<quint16 *>(rasterBuffer->scanLine(y)) + x;

    bool failed = false;
    for (int k = 0; k < length; ++k) {
        if (buffer[k].red() != buffer[k].green() || buffer[k].red() != buffer[k].blue()) {
            failed = true;
            break;
        }
        data[k] = buffer[k].red();
    }
    if (failed) { // Non-gray colors
        QColorSpace fromCS = rasterBuffer->colorSpace.isValid() ? rasterBuffer->colorSpace : QColorSpace::SRgb;
        QColorTransform tf = QColorSpacePrivate::get(fromCS)->transformationToXYZ();
        QColorTransformPrivate *tfd = QColorTransformPrivate::get(tf);
        tfd->apply(data, buffer, length, QColorTransformPrivate::InputPremultiplied);
    }
}